

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
mvm::assembler<(anonymous_namespace)::mini_set,_mvm::bytecode_serializer>::assemble
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          assembler<(anonymous_namespace)::mini_set,_mvm::bytecode_serializer> *this,string *line)

{
  pointer *this_00;
  bool bVar1;
  const_iterator ppcVar2;
  const_iterator __last;
  char **ppcVar3;
  mexcept *pmVar4;
  allocator<char> local_2b21;
  string local_2b20;
  undefined1 local_2afa;
  allocator<char> local_2af9;
  string local_2af8;
  undefined1 local_2ad2;
  allocator<char> local_2ad1;
  string local_2ad0;
  undefined1 local_2aaa;
  allocator<char> local_2aa9;
  string local_2aa8;
  undefined1 local_2a82;
  allocator<char> local_2a81;
  string local_2a80;
  undefined1 local_2a5a;
  allocator<char> local_2a59;
  string local_2a58;
  undefined1 local_2a32;
  allocator<char> local_2a31;
  string local_2a30;
  undefined1 local_2a0a;
  allocator<char> local_2a09;
  string local_2a08;
  undefined1 local_29e2;
  allocator<char> local_29e1;
  string local_29e0;
  undefined1 local_29ba;
  allocator<char> local_29b9;
  string local_29b8;
  undefined1 local_2992;
  allocator<char> local_2991;
  string local_2990;
  undefined1 local_296a;
  allocator<char> local_2969;
  string local_2968;
  undefined1 local_2942;
  allocator<char> local_2941;
  string local_2940;
  undefined1 local_291a;
  allocator<char> local_2919;
  string local_2918;
  undefined1 local_28f2;
  allocator<char> local_28f1;
  string local_28f0;
  undefined1 local_28ca;
  allocator<char> local_28c9;
  string local_28c8;
  undefined1 local_28a2;
  allocator<char> local_28a1;
  string local_28a0;
  undefined1 local_287a;
  allocator<char> local_2879;
  string local_2878;
  undefined1 local_2852;
  allocator<char> local_2851;
  string local_2850;
  undefined1 local_282a;
  allocator<char> local_2829;
  string local_2828;
  undefined1 local_2802;
  allocator<char> local_2801;
  string local_2800;
  undefined1 local_27da;
  allocator<char> local_27d9;
  string local_27d8;
  undefined1 local_27b2;
  allocator<char> local_27b1;
  string local_27b0;
  undefined1 local_278a;
  allocator<char> local_2789;
  string local_2788;
  undefined1 local_2762;
  allocator<char> local_2761;
  string local_2760;
  undefined1 local_273a;
  allocator<char> local_2739;
  string local_2738;
  undefined1 local_2712;
  allocator<char> local_2711;
  string local_2710;
  undefined1 local_26ea;
  allocator<char> local_26e9;
  string local_26e8;
  undefined1 local_26c2;
  allocator<char> local_26c1;
  string local_26c0;
  undefined1 local_269a;
  allocator<char> local_2699;
  string local_2698;
  undefined1 local_2672;
  allocator<char> local_2671;
  string local_2670;
  undefined1 local_264a;
  allocator<char> local_2649;
  string local_2648;
  undefined1 local_2622;
  allocator<char> local_2621;
  string local_2620;
  undefined1 local_25fa;
  allocator<char> local_25f9;
  string local_25f8;
  undefined1 local_25d2;
  allocator<char> local_25d1;
  string local_25d0;
  undefined1 local_25aa;
  allocator<char> local_25a9;
  string local_25a8;
  undefined1 local_2582;
  allocator<char> local_2581;
  string local_2580;
  undefined1 local_255a;
  allocator<char> local_2559;
  string local_2558;
  undefined1 local_2532;
  allocator<char> local_2531;
  string local_2530;
  undefined1 local_250a;
  allocator<char> local_2509;
  string local_2508;
  undefined1 local_24e2;
  allocator<char> local_24e1;
  string local_24e0;
  undefined1 local_24ba;
  allocator<char> local_24b9;
  string local_24b8;
  undefined1 local_2492;
  allocator<char> local_2491;
  string local_2490;
  undefined1 local_246a;
  allocator<char> local_2469;
  string local_2468;
  undefined1 local_2442;
  allocator<char> local_2441;
  string local_2440;
  undefined1 local_241a;
  allocator<char> local_2419;
  string local_2418;
  undefined1 local_23f2;
  allocator<char> local_23f1;
  string local_23f0;
  undefined1 local_23ca;
  allocator<char> local_23c9;
  string local_23c8;
  undefined1 local_23a2;
  allocator<char> local_23a1;
  string local_23a0;
  undefined1 local_237a;
  allocator<char> local_2379;
  string local_2378;
  undefined1 local_2352;
  allocator<char> local_2351;
  string local_2350;
  undefined1 local_232a;
  allocator<char> local_2329;
  string local_2328;
  undefined1 local_2302;
  allocator<char> local_2301;
  string local_2300;
  undefined1 local_22da;
  allocator<char> local_22d9;
  string local_22d8;
  undefined1 local_22b2;
  allocator<char> local_22b1;
  string local_22b0;
  undefined1 local_228a;
  allocator<char> local_2289;
  string local_2288;
  undefined1 local_2262;
  allocator<char> local_2261;
  string local_2260;
  undefined1 local_223a;
  allocator<char> local_2239;
  string local_2238;
  undefined1 local_2212;
  allocator<char> local_2211;
  string local_2210;
  undefined1 local_21ea;
  allocator<char> local_21e9;
  string local_21e8;
  undefined1 local_21c2;
  allocator<char> local_21c1;
  string local_21c0;
  undefined1 local_219a;
  allocator<char> local_2199;
  string local_2198;
  undefined1 local_2172;
  allocator<char> local_2171;
  string local_2170;
  undefined1 local_214a;
  allocator<char> local_2149;
  string local_2148;
  undefined1 local_2122;
  allocator<char> local_2121;
  string local_2120;
  undefined1 local_20fa;
  allocator<char> local_20f9;
  string local_20f8;
  undefined1 local_20d2;
  allocator<char> local_20d1;
  string local_20d0;
  undefined1 local_20aa;
  allocator<char> local_20a9;
  string local_20a8;
  undefined1 local_2082;
  allocator<char> local_2081;
  string local_2080;
  undefined1 local_205a;
  allocator<char> local_2059;
  string local_2058;
  undefined1 local_2032;
  allocator<char> local_2031;
  string local_2030;
  undefined1 local_200a;
  allocator<char> local_2009;
  string local_2008;
  undefined1 local_1fe2;
  allocator<char> local_1fe1;
  string local_1fe0;
  undefined1 local_1fba;
  allocator<char> local_1fb9;
  string local_1fb8;
  undefined1 local_1f92;
  allocator<char> local_1f91;
  string local_1f90;
  undefined1 local_1f6a;
  allocator<char> local_1f69;
  string local_1f68;
  undefined1 local_1f42;
  allocator<char> local_1f41;
  string local_1f40;
  undefined1 local_1f1a;
  allocator<char> local_1f19;
  string local_1f18;
  undefined1 local_1ef2;
  allocator<char> local_1ef1;
  string local_1ef0;
  undefined1 local_1eca;
  allocator<char> local_1ec9;
  string local_1ec8;
  undefined1 local_1ea2;
  allocator<char> local_1ea1;
  string local_1ea0;
  undefined1 local_1e7a;
  allocator<char> local_1e79;
  string local_1e78;
  undefined1 local_1e52;
  allocator<char> local_1e51;
  string local_1e50;
  undefined1 local_1e2a;
  allocator<char> local_1e29;
  string local_1e28;
  undefined1 local_1e02;
  allocator<char> local_1e01;
  string local_1e00;
  undefined1 local_1dda;
  allocator<char> local_1dd9;
  string local_1dd8;
  undefined1 local_1db2;
  allocator<char> local_1db1;
  string local_1db0;
  undefined1 local_1d8a;
  allocator<char> local_1d89;
  string local_1d88;
  undefined1 local_1d62;
  allocator<char> local_1d61;
  string local_1d60;
  undefined1 local_1d3a;
  allocator<char> local_1d39;
  string local_1d38;
  undefined1 local_1d12;
  allocator<char> local_1d11;
  string local_1d10;
  undefined1 local_1cea;
  allocator<char> local_1ce9;
  string local_1ce8;
  undefined1 local_1cc2;
  allocator<char> local_1cc1;
  string local_1cc0;
  undefined1 local_1c9a;
  allocator<char> local_1c99;
  string local_1c98;
  undefined1 local_1c72;
  allocator<char> local_1c71;
  string local_1c70;
  undefined1 local_1c4a;
  allocator<char> local_1c49;
  string local_1c48;
  undefined1 local_1c22;
  allocator<char> local_1c21;
  string local_1c20;
  undefined1 local_1bfa;
  allocator<char> local_1bf9;
  string local_1bf8;
  undefined1 local_1bd2;
  allocator<char> local_1bd1;
  string local_1bd0;
  undefined1 local_1baa;
  allocator<char> local_1ba9;
  string local_1ba8;
  undefined1 local_1b82;
  allocator<char> local_1b81;
  string local_1b80;
  undefined1 local_1b5a;
  allocator<char> local_1b59;
  string local_1b58;
  undefined1 local_1b32;
  allocator<char> local_1b31;
  string local_1b30;
  undefined1 local_1b0a;
  allocator<char> local_1b09;
  string local_1b08;
  undefined1 local_1ae2;
  allocator<char> local_1ae1;
  string local_1ae0;
  undefined1 local_1aba;
  allocator<char> local_1ab9;
  string local_1ab8;
  undefined1 local_1a92;
  allocator<char> local_1a91;
  string local_1a90;
  undefined1 local_1a6a;
  allocator<char> local_1a69;
  string local_1a68;
  undefined1 local_1a42;
  allocator<char> local_1a41;
  string local_1a40;
  undefined1 local_1a1a;
  allocator<char> local_1a19;
  string local_1a18;
  undefined1 local_19f2;
  allocator<char> local_19f1;
  string local_19f0;
  undefined1 local_19ca;
  allocator<char> local_19c9;
  string local_19c8;
  undefined1 local_19a2;
  allocator<char> local_19a1;
  string local_19a0;
  undefined1 local_197a;
  allocator<char> local_1979;
  string local_1978;
  undefined1 local_1952;
  allocator<char> local_1951;
  string local_1950;
  undefined1 local_192a;
  allocator<char> local_1929;
  string local_1928;
  undefined1 local_1902;
  allocator<char> local_1901;
  string local_1900;
  undefined1 local_18da;
  allocator<char> local_18d9;
  string local_18d8;
  undefined1 local_18b2;
  allocator<char> local_18b1;
  string local_18b0;
  undefined1 local_188a;
  allocator<char> local_1889;
  string local_1888;
  undefined1 local_1862;
  allocator<char> local_1861;
  string local_1860;
  undefined1 local_183a;
  allocator<char> local_1839;
  string local_1838;
  undefined1 local_1812;
  allocator<char> local_1811;
  string local_1810;
  undefined1 local_17ea;
  allocator<char> local_17e9;
  string local_17e8;
  undefined1 local_17c2;
  allocator<char> local_17c1;
  string local_17c0;
  undefined1 local_179a;
  allocator<char> local_1799;
  string local_1798;
  undefined1 local_1772;
  allocator<char> local_1771;
  string local_1770;
  undefined1 local_174a;
  allocator<char> local_1749;
  string local_1748;
  undefined1 local_1722;
  allocator<char> local_1721;
  string local_1720;
  undefined1 local_16fa;
  allocator<char> local_16f9;
  string local_16f8;
  undefined1 local_16d2;
  allocator<char> local_16d1;
  string local_16d0;
  undefined1 local_16aa;
  allocator<char> local_16a9;
  string local_16a8;
  undefined1 local_1682;
  allocator<char> local_1681;
  string local_1680;
  undefined1 local_165a;
  allocator<char> local_1659;
  string local_1658;
  undefined1 local_1632;
  allocator<char> local_1631;
  string local_1630;
  undefined1 local_160a;
  allocator<char> local_1609;
  string local_1608;
  undefined1 local_15e2;
  allocator<char> local_15e1;
  string local_15e0;
  undefined1 local_15ba;
  allocator<char> local_15b9;
  string local_15b8;
  undefined1 local_1592;
  allocator<char> local_1591;
  string local_1590;
  undefined1 local_156a;
  allocator<char> local_1569;
  string local_1568;
  undefined1 local_1542;
  allocator<char> local_1541;
  string local_1540;
  undefined1 local_151a;
  allocator<char> local_1519;
  string local_1518;
  undefined1 local_14f2;
  allocator<char> local_14f1;
  string local_14f0;
  undefined1 local_14ca;
  allocator<char> local_14c9;
  string local_14c8;
  undefined1 local_14a2;
  allocator<char> local_14a1;
  string local_14a0;
  undefined1 local_147a;
  allocator<char> local_1479;
  string local_1478;
  undefined1 local_1452;
  allocator<char> local_1451;
  string local_1450;
  undefined1 local_142a;
  allocator<char> local_1429;
  string local_1428;
  undefined1 local_1402;
  allocator<char> local_1401;
  string local_1400;
  undefined1 local_13da;
  allocator<char> local_13d9;
  string local_13d8;
  undefined1 local_13b2;
  allocator<char> local_13b1;
  string local_13b0;
  undefined1 local_138a;
  allocator<char> local_1389;
  string local_1388;
  undefined1 local_1362;
  allocator<char> local_1361;
  string local_1360;
  undefined1 local_133a;
  allocator<char> local_1339;
  string local_1338;
  undefined1 local_1312;
  allocator<char> local_1311;
  string local_1310;
  undefined1 local_12ea;
  allocator<char> local_12e9;
  string local_12e8;
  undefined1 local_12c2;
  allocator<char> local_12c1;
  string local_12c0;
  undefined1 local_129a;
  allocator<char> local_1299;
  string local_1298;
  undefined1 local_1272;
  allocator<char> local_1271;
  string local_1270;
  undefined1 local_124a;
  allocator<char> local_1249;
  string local_1248;
  undefined1 local_1222;
  allocator<char> local_1221;
  string local_1220;
  undefined1 local_11fa;
  allocator<char> local_11f9;
  string local_11f8;
  undefined1 local_11d2;
  allocator<char> local_11d1;
  string local_11d0;
  undefined1 local_11aa;
  allocator<char> local_11a9;
  string local_11a8;
  undefined1 local_1182;
  allocator<char> local_1181;
  string local_1180;
  undefined1 local_115a;
  allocator<char> local_1159;
  string local_1158;
  undefined1 local_1132;
  allocator<char> local_1131;
  string local_1130;
  undefined1 local_110a;
  allocator<char> local_1109;
  string local_1108;
  undefined1 local_10e2;
  allocator<char> local_10e1;
  string local_10e0;
  undefined1 local_10ba;
  allocator<char> local_10b9;
  string local_10b8;
  undefined1 local_1092;
  allocator<char> local_1091;
  string local_1090;
  undefined1 local_106a;
  allocator<char> local_1069;
  string local_1068;
  undefined1 local_1042;
  allocator<char> local_1041;
  string local_1040;
  undefined1 local_101a;
  allocator<char> local_1019;
  string local_1018;
  undefined1 local_ff2;
  allocator<char> local_ff1;
  string local_ff0;
  undefined1 local_fca;
  allocator<char> local_fc9;
  string local_fc8;
  undefined1 local_fa2;
  allocator<char> local_fa1;
  string local_fa0;
  undefined1 local_f7a;
  allocator<char> local_f79;
  string local_f78;
  undefined1 local_f52;
  allocator<char> local_f51;
  string local_f50;
  undefined1 local_f2a;
  allocator<char> local_f29;
  string local_f28;
  undefined1 local_f02;
  allocator<char> local_f01;
  string local_f00;
  undefined1 local_eda;
  allocator<char> local_ed9;
  string local_ed8;
  undefined1 local_eb2;
  allocator<char> local_eb1;
  string local_eb0;
  undefined1 local_e8a;
  allocator<char> local_e89;
  string local_e88;
  undefined1 local_e62;
  allocator<char> local_e61;
  string local_e60;
  undefined1 local_e3a;
  allocator<char> local_e39;
  string local_e38;
  undefined1 local_e12;
  allocator<char> local_e11;
  string local_e10;
  undefined1 local_dea;
  allocator<char> local_de9;
  string local_de8;
  undefined1 local_dc2;
  allocator<char> local_dc1;
  string local_dc0;
  undefined1 local_d9a;
  allocator<char> local_d99;
  string local_d98;
  undefined1 local_d72;
  allocator<char> local_d71;
  string local_d70;
  undefined1 local_d4a;
  allocator<char> local_d49;
  string local_d48;
  undefined1 local_d22;
  allocator<char> local_d21;
  string local_d20;
  undefined1 local_cfa;
  allocator<char> local_cf9;
  string local_cf8;
  undefined1 local_cd2;
  allocator<char> local_cd1;
  string local_cd0;
  undefined1 local_caa;
  allocator<char> local_ca9;
  string local_ca8;
  undefined1 local_c82;
  allocator<char> local_c81;
  string local_c80;
  undefined1 local_c5a;
  allocator<char> local_c59;
  string local_c58;
  undefined1 local_c32;
  allocator<char> local_c31;
  string local_c30;
  undefined1 local_c0a;
  allocator<char> local_c09;
  string local_c08;
  undefined1 local_be2;
  allocator<char> local_be1;
  string local_be0;
  undefined1 local_bba;
  allocator<char> local_bb9;
  string local_bb8;
  undefined1 local_b92;
  allocator<char> local_b91;
  string local_b90;
  undefined1 local_b6a;
  allocator<char> local_b69;
  string local_b68;
  undefined1 local_b42;
  allocator<char> local_b41;
  string local_b40;
  undefined1 local_b1a;
  allocator<char> local_b19;
  string local_b18;
  undefined1 local_af2;
  allocator<char> local_af1;
  string local_af0;
  undefined1 local_aca;
  allocator<char> local_ac9;
  string local_ac8;
  undefined1 local_aa2;
  allocator<char> local_aa1;
  string local_aa0;
  undefined1 local_a7a;
  allocator<char> local_a79;
  string local_a78;
  undefined1 local_a52;
  allocator<char> local_a51;
  string local_a50;
  undefined1 local_a2a;
  allocator<char> local_a29;
  string local_a28;
  undefined1 local_a02;
  allocator<char> local_a01;
  string local_a00;
  undefined1 local_9da;
  allocator<char> local_9d9;
  string local_9d8;
  undefined1 local_9b2;
  allocator<char> local_9b1;
  string local_9b0;
  undefined1 local_98a;
  allocator<char> local_989;
  string local_988;
  undefined1 local_962;
  allocator<char> local_961;
  string local_960;
  undefined1 local_93a;
  allocator<char> local_939;
  string local_938;
  undefined1 local_912;
  allocator<char> local_911;
  string local_910;
  undefined1 local_8ea;
  allocator<char> local_8e9;
  string local_8e8;
  undefined1 local_8c2;
  allocator<char> local_8c1;
  string local_8c0;
  undefined1 local_89a;
  allocator<char> local_899;
  string local_898;
  undefined1 local_872;
  allocator<char> local_871;
  string local_870;
  undefined1 local_84a;
  allocator<char> local_849;
  string local_848;
  undefined1 local_822;
  allocator<char> local_821;
  string local_820;
  undefined1 local_7fa;
  allocator<char> local_7f9;
  string local_7f8;
  undefined1 local_7d2;
  allocator<char> local_7d1;
  string local_7d0;
  undefined1 local_7aa;
  allocator<char> local_7a9;
  string local_7a8;
  undefined1 local_782;
  allocator<char> local_781;
  string local_780;
  undefined1 local_75a;
  allocator<char> local_759;
  string local_758;
  undefined1 local_732;
  allocator<char> local_731;
  string local_730;
  undefined1 local_70a;
  allocator<char> local_709;
  string local_708;
  undefined1 local_6e2;
  allocator<char> local_6e1;
  string local_6e0;
  undefined1 local_6ba;
  allocator<char> local_6b9;
  string local_6b8;
  undefined1 local_692;
  allocator<char> local_691;
  string local_690;
  undefined1 local_66a;
  allocator<char> local_669;
  string local_668;
  undefined1 local_642;
  allocator<char> local_641;
  string local_640;
  undefined1 local_61a;
  allocator<char> local_619;
  string local_618;
  undefined1 local_5f2;
  allocator<char> local_5f1;
  string local_5f0;
  undefined1 local_5ca;
  allocator<char> local_5c9;
  string local_5c8;
  undefined1 local_5a2;
  allocator<char> local_5a1;
  string local_5a0;
  undefined1 local_57a;
  allocator<char> local_579;
  string local_578;
  undefined1 local_552;
  allocator<char> local_551;
  string local_550;
  undefined1 local_52a;
  allocator<char> local_529;
  string local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_500;
  const_iterator local_4f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4d0;
  const_iterator local_4c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4a0;
  const_iterator local_498;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_478;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_470;
  const_iterator local_468;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_448;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_440;
  const_iterator local_438;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_410;
  const_iterator local_408;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e0;
  const_iterator local_3d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b0;
  const_iterator local_3a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_380;
  const_iterator local_378;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_350;
  const_iterator local_348;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_320;
  const_iterator local_318;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f0;
  const_iterator local_2e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c0;
  const_iterator local_2b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b0;
  difference_type local_298;
  difference_type instr_index;
  string local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_268;
  char **local_260;
  char **iname_it;
  string local_250;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_229;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_228;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_1e8;
  undefined1 local_1b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  istringstream iss;
  string *line_local;
  assembler<(anonymous_namespace)::mini_set,_mvm::bytecode_serializer> *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytecode;
  
  this_00 = &tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::istringstream::istringstream((istringstream *)this_00,(string *)line,_S_in);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_1e8,(istream_type *)this_00);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_228);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_229);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1b8,
             &local_1e8,&local_228,&local_229);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_229);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::~istream_iterator(&local_228);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::~istream_iterator(&local_1e8);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b8);
  if (bVar1) {
    iname_it._6_1_ = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"[-][mvm] no instruction token",
               (allocator<char> *)((long)&iname_it + 7));
    mexcept::mexcept(pmVar4,&local_250,NO_INSTR_NAME);
    iname_it._6_1_ = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  }
  ppcVar2 = std::cbegin<std::array<char_const*const,13ul>>
                      (&traits::instr_set_traits<(anonymous_namespace)::mini_set>::instr_names);
  __last = std::cend<std::array<char_const*const,13ul>>
                     (&traits::instr_set_traits<(anonymous_namespace)::mini_set>::instr_names);
  local_268 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8;
  ppcVar3 = std::
            find_if<char_const*const*,mvm::assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                      (ppcVar2,__last,(anon_class_8_1_6d6476d8_for__M_pred)local_268);
  local_260 = ppcVar3;
  ppcVar2 = std::cend<std::array<char_const*const,13ul>>
                      (&traits::instr_set_traits<(anonymous_namespace)::mini_set>::instr_names);
  if (ppcVar3 == ppcVar2) {
    instr_index._6_1_ = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"[-][mvm] invalid instruction name",
               (allocator<char> *)((long)&instr_index + 7));
    mexcept::mexcept(pmVar4,&local_288,BAD_INSTR_NAME);
    instr_index._6_1_ = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  }
  instr_index._5_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  ppcVar2 = std::cbegin<std::array<char_const*const,13ul>>
                      (&traits::instr_set_traits<(anonymous_namespace)::mini_set>::instr_names);
  local_298 = std::distance<char_const*const*>(ppcVar2,local_260);
  switch(local_298) {
  case 0:
    local_2c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_2b8,&local_2c0);
    local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_2b8);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>>
              (&local_2b0,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\0',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_2b0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2b0);
    break;
  case 1:
    local_2f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_2e8,&local_2f0);
    local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_2e8);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumer_pipe<mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)111,(char)112,(char)0>>>
              (&local_2e0,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\x01',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_2e0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2e0);
    break;
  case 2:
    local_320._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_318,&local_320);
    local_328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_318);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&(anonymous_namespace)::mini_set::read,mvm::typestring::type_string<(char)114,(char)101,(char)97,(char)100,(char)0>>>
              (&local_310,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\x02',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_310);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_310);
    break;
  case 3:
    local_350._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_348,&local_350);
    local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_348);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&(anonymous_namespace)::mini_set::write,mvm::typestring::type_string<(char)119,(char)114,(char)105,(char)116,(char)101,(char)0>>>
              (&local_340,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\x03',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_340);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_340);
    break;
  case 4:
    local_380._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_378,&local_380);
    local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_378);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,false,&(anonymous_namespace)::mini_set::dup,mvm::typestring::type_string<(char)100,(char)117,(char)112,(char)0>>>
              (&local_370,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\x04',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_370);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_370);
    break;
  case 5:
    local_3b0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_3a8,&local_3b0);
    local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_3a8);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&(anonymous_namespace)::mini_set::eq,mvm::typestring::type_string<(char)101,(char)113,(char)0>>>
              (&local_3a0,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\x05',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_3a0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3a0);
    break;
  case 6:
    local_3e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_3d8,&local_3e0);
    local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_3d8);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumers_instr<mvm::consumers<mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::meta_tie<mvm::meta_bytecode,unsigned_int>>,true,&(anonymous_namespace)::mini_set::jz,mvm::typestring::type_string<(char)106,(char)122,(char)0>>>
              (&local_3d0,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\x06',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_3d0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3d0);
    break;
  case 7:
    local_410._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_408,&local_410);
    local_418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_408);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumer_instr<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,true,&(anonymous_namespace)::mini_set::jump,mvm::typestring::type_string<(char)106,(char)117,(char)109,(char)112,(char)0>>>
              (&local_400,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\a',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_400);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_400);
    break;
  case 8:
    local_440._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_438,&local_440);
    local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_438);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&(anonymous_namespace)::mini_set::add,mvm::typestring::type_string<(char)97,(char)100,(char)100,(char)0>>>
              (&local_430,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\b',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_430);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_430);
    break;
  case 9:
    local_470._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_468,&local_470);
    local_478 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_468);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&(anonymous_namespace)::mini_set::sub,mvm::typestring::type_string<(char)115,(char)117,(char)98,(char)0>>>
              (&local_460,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\t',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_460);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_460);
    break;
  case 10:
    local_4a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_498,&local_4a0);
    local_4a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_498);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&(anonymous_namespace)::mini_set::mul,mvm::typestring::type_string<(char)109,(char)117,(char)108,(char)0>>>
              (&local_490,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\n',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_490);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_490);
    break;
  case 0xb:
    local_4d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_4c8,&local_4d0);
    local_4d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_4c8);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,false,&(anonymous_namespace)::mini_set::swap,mvm::typestring::type_string<(char)115,(char)119,(char)97,(char)112,(char)0>>>
              (&local_4c0,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\v',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_4c0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_4c0);
    break;
  case 0xc:
    local_500._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_4f8,&local_500);
    local_508 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_4f8);
    assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<(anonymous_namespace)::mini_set>::consumer_producer_instr<mvm::iterable_consumer<mvm::meta_value_stack,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,mvm::count_from<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>>>,mvm::meta_tie<mvm::meta_value_stack,std::vector<unsigned_int,std::allocator<unsigned_int>>>,false,&(anonymous_namespace)::mini_set::rotln,mvm::typestring::type_string<(char)114,(char)111,(char)116,(char)108,(char)110,(char)0>>>
              (&local_4f0,
               (assembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *)this,'\f',
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_4f0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_4f0);
    break;
  case 0xd:
    local_52a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"[-][mvm] invalid instruction opcode",&local_529);
    mexcept::mexcept(pmVar4,&local_528,INVALID_INSTR_OPCODE);
    local_52a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe:
    local_552 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_550,"[-][mvm] invalid instruction opcode",&local_551);
    mexcept::mexcept(pmVar4,&local_550,INVALID_INSTR_OPCODE);
    local_552 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf:
    local_57a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_578,"[-][mvm] invalid instruction opcode",&local_579);
    mexcept::mexcept(pmVar4,&local_578,INVALID_INSTR_OPCODE);
    local_57a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x10:
    local_5a2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a0,"[-][mvm] invalid instruction opcode",&local_5a1);
    mexcept::mexcept(pmVar4,&local_5a0,INVALID_INSTR_OPCODE);
    local_5a2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x11:
    local_5ca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c8,"[-][mvm] invalid instruction opcode",&local_5c9);
    mexcept::mexcept(pmVar4,&local_5c8,INVALID_INSTR_OPCODE);
    local_5ca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x12:
    local_5f2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5f0,"[-][mvm] invalid instruction opcode",&local_5f1);
    mexcept::mexcept(pmVar4,&local_5f0,INVALID_INSTR_OPCODE);
    local_5f2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x13:
    local_61a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_618,"[-][mvm] invalid instruction opcode",&local_619);
    mexcept::mexcept(pmVar4,&local_618,INVALID_INSTR_OPCODE);
    local_61a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x14:
    local_642 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_640,"[-][mvm] invalid instruction opcode",&local_641);
    mexcept::mexcept(pmVar4,&local_640,INVALID_INSTR_OPCODE);
    local_642 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x15:
    local_66a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_668,"[-][mvm] invalid instruction opcode",&local_669);
    mexcept::mexcept(pmVar4,&local_668,INVALID_INSTR_OPCODE);
    local_66a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x16:
    local_692 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_690,"[-][mvm] invalid instruction opcode",&local_691);
    mexcept::mexcept(pmVar4,&local_690,INVALID_INSTR_OPCODE);
    local_692 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x17:
    local_6ba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b8,"[-][mvm] invalid instruction opcode",&local_6b9);
    mexcept::mexcept(pmVar4,&local_6b8,INVALID_INSTR_OPCODE);
    local_6ba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x18:
    local_6e2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6e0,"[-][mvm] invalid instruction opcode",&local_6e1);
    mexcept::mexcept(pmVar4,&local_6e0,INVALID_INSTR_OPCODE);
    local_6e2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x19:
    local_70a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_708,"[-][mvm] invalid instruction opcode",&local_709);
    mexcept::mexcept(pmVar4,&local_708,INVALID_INSTR_OPCODE);
    local_70a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1a:
    local_732 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_730,"[-][mvm] invalid instruction opcode",&local_731);
    mexcept::mexcept(pmVar4,&local_730,INVALID_INSTR_OPCODE);
    local_732 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1b:
    local_75a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_758,"[-][mvm] invalid instruction opcode",&local_759);
    mexcept::mexcept(pmVar4,&local_758,INVALID_INSTR_OPCODE);
    local_75a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1c:
    local_782 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_780,"[-][mvm] invalid instruction opcode",&local_781);
    mexcept::mexcept(pmVar4,&local_780,INVALID_INSTR_OPCODE);
    local_782 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1d:
    local_7aa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7a8,"[-][mvm] invalid instruction opcode",&local_7a9);
    mexcept::mexcept(pmVar4,&local_7a8,INVALID_INSTR_OPCODE);
    local_7aa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1e:
    local_7d2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d0,"[-][mvm] invalid instruction opcode",&local_7d1);
    mexcept::mexcept(pmVar4,&local_7d0,INVALID_INSTR_OPCODE);
    local_7d2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1f:
    local_7fa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f8,"[-][mvm] invalid instruction opcode",&local_7f9);
    mexcept::mexcept(pmVar4,&local_7f8,INVALID_INSTR_OPCODE);
    local_7fa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x20:
    local_822 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_820,"[-][mvm] invalid instruction opcode",&local_821);
    mexcept::mexcept(pmVar4,&local_820,INVALID_INSTR_OPCODE);
    local_822 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x21:
    local_84a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_848,"[-][mvm] invalid instruction opcode",&local_849);
    mexcept::mexcept(pmVar4,&local_848,INVALID_INSTR_OPCODE);
    local_84a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x22:
    local_872 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_870,"[-][mvm] invalid instruction opcode",&local_871);
    mexcept::mexcept(pmVar4,&local_870,INVALID_INSTR_OPCODE);
    local_872 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x23:
    local_89a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_898,"[-][mvm] invalid instruction opcode",&local_899);
    mexcept::mexcept(pmVar4,&local_898,INVALID_INSTR_OPCODE);
    local_89a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x24:
    local_8c2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c0,"[-][mvm] invalid instruction opcode",&local_8c1);
    mexcept::mexcept(pmVar4,&local_8c0,INVALID_INSTR_OPCODE);
    local_8c2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x25:
    local_8ea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8e8,"[-][mvm] invalid instruction opcode",&local_8e9);
    mexcept::mexcept(pmVar4,&local_8e8,INVALID_INSTR_OPCODE);
    local_8ea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x26:
    local_912 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_910,"[-][mvm] invalid instruction opcode",&local_911);
    mexcept::mexcept(pmVar4,&local_910,INVALID_INSTR_OPCODE);
    local_912 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x27:
    local_93a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_938,"[-][mvm] invalid instruction opcode",&local_939);
    mexcept::mexcept(pmVar4,&local_938,INVALID_INSTR_OPCODE);
    local_93a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x28:
    local_962 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_960,"[-][mvm] invalid instruction opcode",&local_961);
    mexcept::mexcept(pmVar4,&local_960,INVALID_INSTR_OPCODE);
    local_962 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x29:
    local_98a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_988,"[-][mvm] invalid instruction opcode",&local_989);
    mexcept::mexcept(pmVar4,&local_988,INVALID_INSTR_OPCODE);
    local_98a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2a:
    local_9b2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b0,"[-][mvm] invalid instruction opcode",&local_9b1);
    mexcept::mexcept(pmVar4,&local_9b0,INVALID_INSTR_OPCODE);
    local_9b2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2b:
    local_9da = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9d8,"[-][mvm] invalid instruction opcode",&local_9d9);
    mexcept::mexcept(pmVar4,&local_9d8,INVALID_INSTR_OPCODE);
    local_9da = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2c:
    local_a02 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a00,"[-][mvm] invalid instruction opcode",&local_a01);
    mexcept::mexcept(pmVar4,&local_a00,INVALID_INSTR_OPCODE);
    local_a02 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2d:
    local_a2a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a28,"[-][mvm] invalid instruction opcode",&local_a29);
    mexcept::mexcept(pmVar4,&local_a28,INVALID_INSTR_OPCODE);
    local_a2a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2e:
    local_a52 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a50,"[-][mvm] invalid instruction opcode",&local_a51);
    mexcept::mexcept(pmVar4,&local_a50,INVALID_INSTR_OPCODE);
    local_a52 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2f:
    local_a7a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a78,"[-][mvm] invalid instruction opcode",&local_a79);
    mexcept::mexcept(pmVar4,&local_a78,INVALID_INSTR_OPCODE);
    local_a7a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x30:
    local_aa2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_aa0,"[-][mvm] invalid instruction opcode",&local_aa1);
    mexcept::mexcept(pmVar4,&local_aa0,INVALID_INSTR_OPCODE);
    local_aa2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x31:
    local_aca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ac8,"[-][mvm] invalid instruction opcode",&local_ac9);
    mexcept::mexcept(pmVar4,&local_ac8,INVALID_INSTR_OPCODE);
    local_aca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x32:
    local_af2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af0,"[-][mvm] invalid instruction opcode",&local_af1);
    mexcept::mexcept(pmVar4,&local_af0,INVALID_INSTR_OPCODE);
    local_af2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x33:
    local_b1a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b18,"[-][mvm] invalid instruction opcode",&local_b19);
    mexcept::mexcept(pmVar4,&local_b18,INVALID_INSTR_OPCODE);
    local_b1a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x34:
    local_b42 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b40,"[-][mvm] invalid instruction opcode",&local_b41);
    mexcept::mexcept(pmVar4,&local_b40,INVALID_INSTR_OPCODE);
    local_b42 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x35:
    local_b6a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b68,"[-][mvm] invalid instruction opcode",&local_b69);
    mexcept::mexcept(pmVar4,&local_b68,INVALID_INSTR_OPCODE);
    local_b6a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x36:
    local_b92 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b90,"[-][mvm] invalid instruction opcode",&local_b91);
    mexcept::mexcept(pmVar4,&local_b90,INVALID_INSTR_OPCODE);
    local_b92 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x37:
    local_bba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bb8,"[-][mvm] invalid instruction opcode",&local_bb9);
    mexcept::mexcept(pmVar4,&local_bb8,INVALID_INSTR_OPCODE);
    local_bba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x38:
    local_be2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_be0,"[-][mvm] invalid instruction opcode",&local_be1);
    mexcept::mexcept(pmVar4,&local_be0,INVALID_INSTR_OPCODE);
    local_be2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x39:
    local_c0a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c08,"[-][mvm] invalid instruction opcode",&local_c09);
    mexcept::mexcept(pmVar4,&local_c08,INVALID_INSTR_OPCODE);
    local_c0a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3a:
    local_c32 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c30,"[-][mvm] invalid instruction opcode",&local_c31);
    mexcept::mexcept(pmVar4,&local_c30,INVALID_INSTR_OPCODE);
    local_c32 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3b:
    local_c5a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c58,"[-][mvm] invalid instruction opcode",&local_c59);
    mexcept::mexcept(pmVar4,&local_c58,INVALID_INSTR_OPCODE);
    local_c5a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3c:
    local_c82 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c80,"[-][mvm] invalid instruction opcode",&local_c81);
    mexcept::mexcept(pmVar4,&local_c80,INVALID_INSTR_OPCODE);
    local_c82 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3d:
    local_caa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ca8,"[-][mvm] invalid instruction opcode",&local_ca9);
    mexcept::mexcept(pmVar4,&local_ca8,INVALID_INSTR_OPCODE);
    local_caa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3e:
    local_cd2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cd0,"[-][mvm] invalid instruction opcode",&local_cd1);
    mexcept::mexcept(pmVar4,&local_cd0,INVALID_INSTR_OPCODE);
    local_cd2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3f:
    local_cfa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cf8,"[-][mvm] invalid instruction opcode",&local_cf9);
    mexcept::mexcept(pmVar4,&local_cf8,INVALID_INSTR_OPCODE);
    local_cfa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x40:
    local_d22 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d20,"[-][mvm] invalid instruction opcode",&local_d21);
    mexcept::mexcept(pmVar4,&local_d20,INVALID_INSTR_OPCODE);
    local_d22 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x41:
    local_d4a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d48,"[-][mvm] invalid instruction opcode",&local_d49);
    mexcept::mexcept(pmVar4,&local_d48,INVALID_INSTR_OPCODE);
    local_d4a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x42:
    local_d72 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d70,"[-][mvm] invalid instruction opcode",&local_d71);
    mexcept::mexcept(pmVar4,&local_d70,INVALID_INSTR_OPCODE);
    local_d72 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x43:
    local_d9a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d98,"[-][mvm] invalid instruction opcode",&local_d99);
    mexcept::mexcept(pmVar4,&local_d98,INVALID_INSTR_OPCODE);
    local_d9a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x44:
    local_dc2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_dc0,"[-][mvm] invalid instruction opcode",&local_dc1);
    mexcept::mexcept(pmVar4,&local_dc0,INVALID_INSTR_OPCODE);
    local_dc2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x45:
    local_dea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_de8,"[-][mvm] invalid instruction opcode",&local_de9);
    mexcept::mexcept(pmVar4,&local_de8,INVALID_INSTR_OPCODE);
    local_dea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x46:
    local_e12 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e10,"[-][mvm] invalid instruction opcode",&local_e11);
    mexcept::mexcept(pmVar4,&local_e10,INVALID_INSTR_OPCODE);
    local_e12 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x47:
    local_e3a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e38,"[-][mvm] invalid instruction opcode",&local_e39);
    mexcept::mexcept(pmVar4,&local_e38,INVALID_INSTR_OPCODE);
    local_e3a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x48:
    local_e62 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e60,"[-][mvm] invalid instruction opcode",&local_e61);
    mexcept::mexcept(pmVar4,&local_e60,INVALID_INSTR_OPCODE);
    local_e62 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x49:
    local_e8a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e88,"[-][mvm] invalid instruction opcode",&local_e89);
    mexcept::mexcept(pmVar4,&local_e88,INVALID_INSTR_OPCODE);
    local_e8a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4a:
    local_eb2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_eb0,"[-][mvm] invalid instruction opcode",&local_eb1);
    mexcept::mexcept(pmVar4,&local_eb0,INVALID_INSTR_OPCODE);
    local_eb2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4b:
    local_eda = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ed8,"[-][mvm] invalid instruction opcode",&local_ed9);
    mexcept::mexcept(pmVar4,&local_ed8,INVALID_INSTR_OPCODE);
    local_eda = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4c:
    local_f02 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f00,"[-][mvm] invalid instruction opcode",&local_f01);
    mexcept::mexcept(pmVar4,&local_f00,INVALID_INSTR_OPCODE);
    local_f02 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4d:
    local_f2a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f28,"[-][mvm] invalid instruction opcode",&local_f29);
    mexcept::mexcept(pmVar4,&local_f28,INVALID_INSTR_OPCODE);
    local_f2a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4e:
    local_f52 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f50,"[-][mvm] invalid instruction opcode",&local_f51);
    mexcept::mexcept(pmVar4,&local_f50,INVALID_INSTR_OPCODE);
    local_f52 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4f:
    local_f7a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f78,"[-][mvm] invalid instruction opcode",&local_f79);
    mexcept::mexcept(pmVar4,&local_f78,INVALID_INSTR_OPCODE);
    local_f7a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x50:
    local_fa2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fa0,"[-][mvm] invalid instruction opcode",&local_fa1);
    mexcept::mexcept(pmVar4,&local_fa0,INVALID_INSTR_OPCODE);
    local_fa2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x51:
    local_fca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fc8,"[-][mvm] invalid instruction opcode",&local_fc9);
    mexcept::mexcept(pmVar4,&local_fc8,INVALID_INSTR_OPCODE);
    local_fca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x52:
    local_ff2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ff0,"[-][mvm] invalid instruction opcode",&local_ff1);
    mexcept::mexcept(pmVar4,&local_ff0,INVALID_INSTR_OPCODE);
    local_ff2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x53:
    local_101a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1018,"[-][mvm] invalid instruction opcode",&local_1019);
    mexcept::mexcept(pmVar4,&local_1018,INVALID_INSTR_OPCODE);
    local_101a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x54:
    local_1042 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1040,"[-][mvm] invalid instruction opcode",&local_1041);
    mexcept::mexcept(pmVar4,&local_1040,INVALID_INSTR_OPCODE);
    local_1042 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x55:
    local_106a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1068,"[-][mvm] invalid instruction opcode",&local_1069);
    mexcept::mexcept(pmVar4,&local_1068,INVALID_INSTR_OPCODE);
    local_106a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x56:
    local_1092 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1090,"[-][mvm] invalid instruction opcode",&local_1091);
    mexcept::mexcept(pmVar4,&local_1090,INVALID_INSTR_OPCODE);
    local_1092 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x57:
    local_10ba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10b8,"[-][mvm] invalid instruction opcode",&local_10b9);
    mexcept::mexcept(pmVar4,&local_10b8,INVALID_INSTR_OPCODE);
    local_10ba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x58:
    local_10e2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10e0,"[-][mvm] invalid instruction opcode",&local_10e1);
    mexcept::mexcept(pmVar4,&local_10e0,INVALID_INSTR_OPCODE);
    local_10e2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x59:
    local_110a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1108,"[-][mvm] invalid instruction opcode",&local_1109);
    mexcept::mexcept(pmVar4,&local_1108,INVALID_INSTR_OPCODE);
    local_110a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5a:
    local_1132 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1130,"[-][mvm] invalid instruction opcode",&local_1131);
    mexcept::mexcept(pmVar4,&local_1130,INVALID_INSTR_OPCODE);
    local_1132 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5b:
    local_115a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1158,"[-][mvm] invalid instruction opcode",&local_1159);
    mexcept::mexcept(pmVar4,&local_1158,INVALID_INSTR_OPCODE);
    local_115a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5c:
    local_1182 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1180,"[-][mvm] invalid instruction opcode",&local_1181);
    mexcept::mexcept(pmVar4,&local_1180,INVALID_INSTR_OPCODE);
    local_1182 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5d:
    local_11aa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11a8,"[-][mvm] invalid instruction opcode",&local_11a9);
    mexcept::mexcept(pmVar4,&local_11a8,INVALID_INSTR_OPCODE);
    local_11aa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5e:
    local_11d2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11d0,"[-][mvm] invalid instruction opcode",&local_11d1);
    mexcept::mexcept(pmVar4,&local_11d0,INVALID_INSTR_OPCODE);
    local_11d2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5f:
    local_11fa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11f8,"[-][mvm] invalid instruction opcode",&local_11f9);
    mexcept::mexcept(pmVar4,&local_11f8,INVALID_INSTR_OPCODE);
    local_11fa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x60:
    local_1222 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1220,"[-][mvm] invalid instruction opcode",&local_1221);
    mexcept::mexcept(pmVar4,&local_1220,INVALID_INSTR_OPCODE);
    local_1222 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x61:
    local_124a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1248,"[-][mvm] invalid instruction opcode",&local_1249);
    mexcept::mexcept(pmVar4,&local_1248,INVALID_INSTR_OPCODE);
    local_124a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x62:
    local_1272 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1270,"[-][mvm] invalid instruction opcode",&local_1271);
    mexcept::mexcept(pmVar4,&local_1270,INVALID_INSTR_OPCODE);
    local_1272 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 99:
    local_129a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1298,"[-][mvm] invalid instruction opcode",&local_1299);
    mexcept::mexcept(pmVar4,&local_1298,INVALID_INSTR_OPCODE);
    local_129a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 100:
    local_12c2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12c0,"[-][mvm] invalid instruction opcode",&local_12c1);
    mexcept::mexcept(pmVar4,&local_12c0,INVALID_INSTR_OPCODE);
    local_12c2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x65:
    local_12ea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12e8,"[-][mvm] invalid instruction opcode",&local_12e9);
    mexcept::mexcept(pmVar4,&local_12e8,INVALID_INSTR_OPCODE);
    local_12ea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x66:
    local_1312 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1310,"[-][mvm] invalid instruction opcode",&local_1311);
    mexcept::mexcept(pmVar4,&local_1310,INVALID_INSTR_OPCODE);
    local_1312 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x67:
    local_133a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1338,"[-][mvm] invalid instruction opcode",&local_1339);
    mexcept::mexcept(pmVar4,&local_1338,INVALID_INSTR_OPCODE);
    local_133a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x68:
    local_1362 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1360,"[-][mvm] invalid instruction opcode",&local_1361);
    mexcept::mexcept(pmVar4,&local_1360,INVALID_INSTR_OPCODE);
    local_1362 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x69:
    local_138a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1388,"[-][mvm] invalid instruction opcode",&local_1389);
    mexcept::mexcept(pmVar4,&local_1388,INVALID_INSTR_OPCODE);
    local_138a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6a:
    local_13b2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13b0,"[-][mvm] invalid instruction opcode",&local_13b1);
    mexcept::mexcept(pmVar4,&local_13b0,INVALID_INSTR_OPCODE);
    local_13b2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6b:
    local_13da = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13d8,"[-][mvm] invalid instruction opcode",&local_13d9);
    mexcept::mexcept(pmVar4,&local_13d8,INVALID_INSTR_OPCODE);
    local_13da = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6c:
    local_1402 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1400,"[-][mvm] invalid instruction opcode",&local_1401);
    mexcept::mexcept(pmVar4,&local_1400,INVALID_INSTR_OPCODE);
    local_1402 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6d:
    local_142a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1428,"[-][mvm] invalid instruction opcode",&local_1429);
    mexcept::mexcept(pmVar4,&local_1428,INVALID_INSTR_OPCODE);
    local_142a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6e:
    local_1452 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1450,"[-][mvm] invalid instruction opcode",&local_1451);
    mexcept::mexcept(pmVar4,&local_1450,INVALID_INSTR_OPCODE);
    local_1452 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6f:
    local_147a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1478,"[-][mvm] invalid instruction opcode",&local_1479);
    mexcept::mexcept(pmVar4,&local_1478,INVALID_INSTR_OPCODE);
    local_147a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x70:
    local_14a2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14a0,"[-][mvm] invalid instruction opcode",&local_14a1);
    mexcept::mexcept(pmVar4,&local_14a0,INVALID_INSTR_OPCODE);
    local_14a2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x71:
    local_14ca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14c8,"[-][mvm] invalid instruction opcode",&local_14c9);
    mexcept::mexcept(pmVar4,&local_14c8,INVALID_INSTR_OPCODE);
    local_14ca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x72:
    local_14f2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14f0,"[-][mvm] invalid instruction opcode",&local_14f1);
    mexcept::mexcept(pmVar4,&local_14f0,INVALID_INSTR_OPCODE);
    local_14f2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x73:
    local_151a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1518,"[-][mvm] invalid instruction opcode",&local_1519);
    mexcept::mexcept(pmVar4,&local_1518,INVALID_INSTR_OPCODE);
    local_151a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x74:
    local_1542 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1540,"[-][mvm] invalid instruction opcode",&local_1541);
    mexcept::mexcept(pmVar4,&local_1540,INVALID_INSTR_OPCODE);
    local_1542 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x75:
    local_156a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1568,"[-][mvm] invalid instruction opcode",&local_1569);
    mexcept::mexcept(pmVar4,&local_1568,INVALID_INSTR_OPCODE);
    local_156a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x76:
    local_1592 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1590,"[-][mvm] invalid instruction opcode",&local_1591);
    mexcept::mexcept(pmVar4,&local_1590,INVALID_INSTR_OPCODE);
    local_1592 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x77:
    local_15ba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15b8,"[-][mvm] invalid instruction opcode",&local_15b9);
    mexcept::mexcept(pmVar4,&local_15b8,INVALID_INSTR_OPCODE);
    local_15ba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x78:
    local_15e2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15e0,"[-][mvm] invalid instruction opcode",&local_15e1);
    mexcept::mexcept(pmVar4,&local_15e0,INVALID_INSTR_OPCODE);
    local_15e2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x79:
    local_160a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1608,"[-][mvm] invalid instruction opcode",&local_1609);
    mexcept::mexcept(pmVar4,&local_1608,INVALID_INSTR_OPCODE);
    local_160a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7a:
    local_1632 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1630,"[-][mvm] invalid instruction opcode",&local_1631);
    mexcept::mexcept(pmVar4,&local_1630,INVALID_INSTR_OPCODE);
    local_1632 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7b:
    local_165a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1658,"[-][mvm] invalid instruction opcode",&local_1659);
    mexcept::mexcept(pmVar4,&local_1658,INVALID_INSTR_OPCODE);
    local_165a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7c:
    local_1682 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1680,"[-][mvm] invalid instruction opcode",&local_1681);
    mexcept::mexcept(pmVar4,&local_1680,INVALID_INSTR_OPCODE);
    local_1682 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7d:
    local_16aa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_16a8,"[-][mvm] invalid instruction opcode",&local_16a9);
    mexcept::mexcept(pmVar4,&local_16a8,INVALID_INSTR_OPCODE);
    local_16aa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7e:
    local_16d2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_16d0,"[-][mvm] invalid instruction opcode",&local_16d1);
    mexcept::mexcept(pmVar4,&local_16d0,INVALID_INSTR_OPCODE);
    local_16d2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7f:
    local_16fa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_16f8,"[-][mvm] invalid instruction opcode",&local_16f9);
    mexcept::mexcept(pmVar4,&local_16f8,INVALID_INSTR_OPCODE);
    local_16fa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x80:
    local_1722 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1720,"[-][mvm] invalid instruction opcode",&local_1721);
    mexcept::mexcept(pmVar4,&local_1720,INVALID_INSTR_OPCODE);
    local_1722 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x81:
    local_174a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1748,"[-][mvm] invalid instruction opcode",&local_1749);
    mexcept::mexcept(pmVar4,&local_1748,INVALID_INSTR_OPCODE);
    local_174a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x82:
    local_1772 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1770,"[-][mvm] invalid instruction opcode",&local_1771);
    mexcept::mexcept(pmVar4,&local_1770,INVALID_INSTR_OPCODE);
    local_1772 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x83:
    local_179a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1798,"[-][mvm] invalid instruction opcode",&local_1799);
    mexcept::mexcept(pmVar4,&local_1798,INVALID_INSTR_OPCODE);
    local_179a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x84:
    local_17c2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_17c0,"[-][mvm] invalid instruction opcode",&local_17c1);
    mexcept::mexcept(pmVar4,&local_17c0,INVALID_INSTR_OPCODE);
    local_17c2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x85:
    local_17ea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_17e8,"[-][mvm] invalid instruction opcode",&local_17e9);
    mexcept::mexcept(pmVar4,&local_17e8,INVALID_INSTR_OPCODE);
    local_17ea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x86:
    local_1812 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1810,"[-][mvm] invalid instruction opcode",&local_1811);
    mexcept::mexcept(pmVar4,&local_1810,INVALID_INSTR_OPCODE);
    local_1812 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x87:
    local_183a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1838,"[-][mvm] invalid instruction opcode",&local_1839);
    mexcept::mexcept(pmVar4,&local_1838,INVALID_INSTR_OPCODE);
    local_183a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x88:
    local_1862 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1860,"[-][mvm] invalid instruction opcode",&local_1861);
    mexcept::mexcept(pmVar4,&local_1860,INVALID_INSTR_OPCODE);
    local_1862 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x89:
    local_188a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1888,"[-][mvm] invalid instruction opcode",&local_1889);
    mexcept::mexcept(pmVar4,&local_1888,INVALID_INSTR_OPCODE);
    local_188a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8a:
    local_18b2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_18b0,"[-][mvm] invalid instruction opcode",&local_18b1);
    mexcept::mexcept(pmVar4,&local_18b0,INVALID_INSTR_OPCODE);
    local_18b2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8b:
    local_18da = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_18d8,"[-][mvm] invalid instruction opcode",&local_18d9);
    mexcept::mexcept(pmVar4,&local_18d8,INVALID_INSTR_OPCODE);
    local_18da = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8c:
    local_1902 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1900,"[-][mvm] invalid instruction opcode",&local_1901);
    mexcept::mexcept(pmVar4,&local_1900,INVALID_INSTR_OPCODE);
    local_1902 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8d:
    local_192a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1928,"[-][mvm] invalid instruction opcode",&local_1929);
    mexcept::mexcept(pmVar4,&local_1928,INVALID_INSTR_OPCODE);
    local_192a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8e:
    local_1952 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1950,"[-][mvm] invalid instruction opcode",&local_1951);
    mexcept::mexcept(pmVar4,&local_1950,INVALID_INSTR_OPCODE);
    local_1952 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8f:
    local_197a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1978,"[-][mvm] invalid instruction opcode",&local_1979);
    mexcept::mexcept(pmVar4,&local_1978,INVALID_INSTR_OPCODE);
    local_197a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x90:
    local_19a2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_19a0,"[-][mvm] invalid instruction opcode",&local_19a1);
    mexcept::mexcept(pmVar4,&local_19a0,INVALID_INSTR_OPCODE);
    local_19a2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x91:
    local_19ca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_19c8,"[-][mvm] invalid instruction opcode",&local_19c9);
    mexcept::mexcept(pmVar4,&local_19c8,INVALID_INSTR_OPCODE);
    local_19ca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x92:
    local_19f2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_19f0,"[-][mvm] invalid instruction opcode",&local_19f1);
    mexcept::mexcept(pmVar4,&local_19f0,INVALID_INSTR_OPCODE);
    local_19f2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x93:
    local_1a1a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a18,"[-][mvm] invalid instruction opcode",&local_1a19);
    mexcept::mexcept(pmVar4,&local_1a18,INVALID_INSTR_OPCODE);
    local_1a1a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x94:
    local_1a42 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a40,"[-][mvm] invalid instruction opcode",&local_1a41);
    mexcept::mexcept(pmVar4,&local_1a40,INVALID_INSTR_OPCODE);
    local_1a42 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x95:
    local_1a6a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a68,"[-][mvm] invalid instruction opcode",&local_1a69);
    mexcept::mexcept(pmVar4,&local_1a68,INVALID_INSTR_OPCODE);
    local_1a6a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x96:
    local_1a92 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a90,"[-][mvm] invalid instruction opcode",&local_1a91);
    mexcept::mexcept(pmVar4,&local_1a90,INVALID_INSTR_OPCODE);
    local_1a92 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x97:
    local_1aba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ab8,"[-][mvm] invalid instruction opcode",&local_1ab9);
    mexcept::mexcept(pmVar4,&local_1ab8,INVALID_INSTR_OPCODE);
    local_1aba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x98:
    local_1ae2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ae0,"[-][mvm] invalid instruction opcode",&local_1ae1);
    mexcept::mexcept(pmVar4,&local_1ae0,INVALID_INSTR_OPCODE);
    local_1ae2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x99:
    local_1b0a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b08,"[-][mvm] invalid instruction opcode",&local_1b09);
    mexcept::mexcept(pmVar4,&local_1b08,INVALID_INSTR_OPCODE);
    local_1b0a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9a:
    local_1b32 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b30,"[-][mvm] invalid instruction opcode",&local_1b31);
    mexcept::mexcept(pmVar4,&local_1b30,INVALID_INSTR_OPCODE);
    local_1b32 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9b:
    local_1b5a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b58,"[-][mvm] invalid instruction opcode",&local_1b59);
    mexcept::mexcept(pmVar4,&local_1b58,INVALID_INSTR_OPCODE);
    local_1b5a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9c:
    local_1b82 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b80,"[-][mvm] invalid instruction opcode",&local_1b81);
    mexcept::mexcept(pmVar4,&local_1b80,INVALID_INSTR_OPCODE);
    local_1b82 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9d:
    local_1baa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ba8,"[-][mvm] invalid instruction opcode",&local_1ba9);
    mexcept::mexcept(pmVar4,&local_1ba8,INVALID_INSTR_OPCODE);
    local_1baa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9e:
    local_1bd2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1bd0,"[-][mvm] invalid instruction opcode",&local_1bd1);
    mexcept::mexcept(pmVar4,&local_1bd0,INVALID_INSTR_OPCODE);
    local_1bd2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9f:
    local_1bfa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1bf8,"[-][mvm] invalid instruction opcode",&local_1bf9);
    mexcept::mexcept(pmVar4,&local_1bf8,INVALID_INSTR_OPCODE);
    local_1bfa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa0:
    local_1c22 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c20,"[-][mvm] invalid instruction opcode",&local_1c21);
    mexcept::mexcept(pmVar4,&local_1c20,INVALID_INSTR_OPCODE);
    local_1c22 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa1:
    local_1c4a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c48,"[-][mvm] invalid instruction opcode",&local_1c49);
    mexcept::mexcept(pmVar4,&local_1c48,INVALID_INSTR_OPCODE);
    local_1c4a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa2:
    local_1c72 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c70,"[-][mvm] invalid instruction opcode",&local_1c71);
    mexcept::mexcept(pmVar4,&local_1c70,INVALID_INSTR_OPCODE);
    local_1c72 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa3:
    local_1c9a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c98,"[-][mvm] invalid instruction opcode",&local_1c99);
    mexcept::mexcept(pmVar4,&local_1c98,INVALID_INSTR_OPCODE);
    local_1c9a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa4:
    local_1cc2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1cc0,"[-][mvm] invalid instruction opcode",&local_1cc1);
    mexcept::mexcept(pmVar4,&local_1cc0,INVALID_INSTR_OPCODE);
    local_1cc2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa5:
    local_1cea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ce8,"[-][mvm] invalid instruction opcode",&local_1ce9);
    mexcept::mexcept(pmVar4,&local_1ce8,INVALID_INSTR_OPCODE);
    local_1cea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa6:
    local_1d12 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d10,"[-][mvm] invalid instruction opcode",&local_1d11);
    mexcept::mexcept(pmVar4,&local_1d10,INVALID_INSTR_OPCODE);
    local_1d12 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa7:
    local_1d3a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d38,"[-][mvm] invalid instruction opcode",&local_1d39);
    mexcept::mexcept(pmVar4,&local_1d38,INVALID_INSTR_OPCODE);
    local_1d3a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa8:
    local_1d62 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d60,"[-][mvm] invalid instruction opcode",&local_1d61);
    mexcept::mexcept(pmVar4,&local_1d60,INVALID_INSTR_OPCODE);
    local_1d62 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa9:
    local_1d8a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d88,"[-][mvm] invalid instruction opcode",&local_1d89);
    mexcept::mexcept(pmVar4,&local_1d88,INVALID_INSTR_OPCODE);
    local_1d8a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xaa:
    local_1db2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1db0,"[-][mvm] invalid instruction opcode",&local_1db1);
    mexcept::mexcept(pmVar4,&local_1db0,INVALID_INSTR_OPCODE);
    local_1db2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xab:
    local_1dda = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1dd8,"[-][mvm] invalid instruction opcode",&local_1dd9);
    mexcept::mexcept(pmVar4,&local_1dd8,INVALID_INSTR_OPCODE);
    local_1dda = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xac:
    local_1e02 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e00,"[-][mvm] invalid instruction opcode",&local_1e01);
    mexcept::mexcept(pmVar4,&local_1e00,INVALID_INSTR_OPCODE);
    local_1e02 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xad:
    local_1e2a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e28,"[-][mvm] invalid instruction opcode",&local_1e29);
    mexcept::mexcept(pmVar4,&local_1e28,INVALID_INSTR_OPCODE);
    local_1e2a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xae:
    local_1e52 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e50,"[-][mvm] invalid instruction opcode",&local_1e51);
    mexcept::mexcept(pmVar4,&local_1e50,INVALID_INSTR_OPCODE);
    local_1e52 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xaf:
    local_1e7a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e78,"[-][mvm] invalid instruction opcode",&local_1e79);
    mexcept::mexcept(pmVar4,&local_1e78,INVALID_INSTR_OPCODE);
    local_1e7a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb0:
    local_1ea2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ea0,"[-][mvm] invalid instruction opcode",&local_1ea1);
    mexcept::mexcept(pmVar4,&local_1ea0,INVALID_INSTR_OPCODE);
    local_1ea2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb1:
    local_1eca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ec8,"[-][mvm] invalid instruction opcode",&local_1ec9);
    mexcept::mexcept(pmVar4,&local_1ec8,INVALID_INSTR_OPCODE);
    local_1eca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb2:
    local_1ef2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ef0,"[-][mvm] invalid instruction opcode",&local_1ef1);
    mexcept::mexcept(pmVar4,&local_1ef0,INVALID_INSTR_OPCODE);
    local_1ef2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb3:
    local_1f1a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f18,"[-][mvm] invalid instruction opcode",&local_1f19);
    mexcept::mexcept(pmVar4,&local_1f18,INVALID_INSTR_OPCODE);
    local_1f1a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb4:
    local_1f42 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f40,"[-][mvm] invalid instruction opcode",&local_1f41);
    mexcept::mexcept(pmVar4,&local_1f40,INVALID_INSTR_OPCODE);
    local_1f42 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb5:
    local_1f6a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f68,"[-][mvm] invalid instruction opcode",&local_1f69);
    mexcept::mexcept(pmVar4,&local_1f68,INVALID_INSTR_OPCODE);
    local_1f6a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb6:
    local_1f92 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f90,"[-][mvm] invalid instruction opcode",&local_1f91);
    mexcept::mexcept(pmVar4,&local_1f90,INVALID_INSTR_OPCODE);
    local_1f92 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb7:
    local_1fba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1fb8,"[-][mvm] invalid instruction opcode",&local_1fb9);
    mexcept::mexcept(pmVar4,&local_1fb8,INVALID_INSTR_OPCODE);
    local_1fba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb8:
    local_1fe2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1fe0,"[-][mvm] invalid instruction opcode",&local_1fe1);
    mexcept::mexcept(pmVar4,&local_1fe0,INVALID_INSTR_OPCODE);
    local_1fe2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb9:
    local_200a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2008,"[-][mvm] invalid instruction opcode",&local_2009);
    mexcept::mexcept(pmVar4,&local_2008,INVALID_INSTR_OPCODE);
    local_200a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xba:
    local_2032 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2030,"[-][mvm] invalid instruction opcode",&local_2031);
    mexcept::mexcept(pmVar4,&local_2030,INVALID_INSTR_OPCODE);
    local_2032 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbb:
    local_205a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2058,"[-][mvm] invalid instruction opcode",&local_2059);
    mexcept::mexcept(pmVar4,&local_2058,INVALID_INSTR_OPCODE);
    local_205a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbc:
    local_2082 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2080,"[-][mvm] invalid instruction opcode",&local_2081);
    mexcept::mexcept(pmVar4,&local_2080,INVALID_INSTR_OPCODE);
    local_2082 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbd:
    local_20aa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_20a8,"[-][mvm] invalid instruction opcode",&local_20a9);
    mexcept::mexcept(pmVar4,&local_20a8,INVALID_INSTR_OPCODE);
    local_20aa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbe:
    local_20d2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_20d0,"[-][mvm] invalid instruction opcode",&local_20d1);
    mexcept::mexcept(pmVar4,&local_20d0,INVALID_INSTR_OPCODE);
    local_20d2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbf:
    local_20fa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_20f8,"[-][mvm] invalid instruction opcode",&local_20f9);
    mexcept::mexcept(pmVar4,&local_20f8,INVALID_INSTR_OPCODE);
    local_20fa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc0:
    local_2122 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2120,"[-][mvm] invalid instruction opcode",&local_2121);
    mexcept::mexcept(pmVar4,&local_2120,INVALID_INSTR_OPCODE);
    local_2122 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc1:
    local_214a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2148,"[-][mvm] invalid instruction opcode",&local_2149);
    mexcept::mexcept(pmVar4,&local_2148,INVALID_INSTR_OPCODE);
    local_214a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc2:
    local_2172 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2170,"[-][mvm] invalid instruction opcode",&local_2171);
    mexcept::mexcept(pmVar4,&local_2170,INVALID_INSTR_OPCODE);
    local_2172 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc3:
    local_219a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2198,"[-][mvm] invalid instruction opcode",&local_2199);
    mexcept::mexcept(pmVar4,&local_2198,INVALID_INSTR_OPCODE);
    local_219a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc4:
    local_21c2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_21c0,"[-][mvm] invalid instruction opcode",&local_21c1);
    mexcept::mexcept(pmVar4,&local_21c0,INVALID_INSTR_OPCODE);
    local_21c2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc5:
    local_21ea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_21e8,"[-][mvm] invalid instruction opcode",&local_21e9);
    mexcept::mexcept(pmVar4,&local_21e8,INVALID_INSTR_OPCODE);
    local_21ea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc6:
    local_2212 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2210,"[-][mvm] invalid instruction opcode",&local_2211);
    mexcept::mexcept(pmVar4,&local_2210,INVALID_INSTR_OPCODE);
    local_2212 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 199:
    local_223a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2238,"[-][mvm] invalid instruction opcode",&local_2239);
    mexcept::mexcept(pmVar4,&local_2238,INVALID_INSTR_OPCODE);
    local_223a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 200:
    local_2262 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2260,"[-][mvm] invalid instruction opcode",&local_2261);
    mexcept::mexcept(pmVar4,&local_2260,INVALID_INSTR_OPCODE);
    local_2262 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc9:
    local_228a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2288,"[-][mvm] invalid instruction opcode",&local_2289);
    mexcept::mexcept(pmVar4,&local_2288,INVALID_INSTR_OPCODE);
    local_228a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xca:
    local_22b2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_22b0,"[-][mvm] invalid instruction opcode",&local_22b1);
    mexcept::mexcept(pmVar4,&local_22b0,INVALID_INSTR_OPCODE);
    local_22b2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcb:
    local_22da = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_22d8,"[-][mvm] invalid instruction opcode",&local_22d9);
    mexcept::mexcept(pmVar4,&local_22d8,INVALID_INSTR_OPCODE);
    local_22da = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcc:
    local_2302 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2300,"[-][mvm] invalid instruction opcode",&local_2301);
    mexcept::mexcept(pmVar4,&local_2300,INVALID_INSTR_OPCODE);
    local_2302 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcd:
    local_232a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2328,"[-][mvm] invalid instruction opcode",&local_2329);
    mexcept::mexcept(pmVar4,&local_2328,INVALID_INSTR_OPCODE);
    local_232a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xce:
    local_2352 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2350,"[-][mvm] invalid instruction opcode",&local_2351);
    mexcept::mexcept(pmVar4,&local_2350,INVALID_INSTR_OPCODE);
    local_2352 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcf:
    local_237a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2378,"[-][mvm] invalid instruction opcode",&local_2379);
    mexcept::mexcept(pmVar4,&local_2378,INVALID_INSTR_OPCODE);
    local_237a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd0:
    local_23a2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_23a0,"[-][mvm] invalid instruction opcode",&local_23a1);
    mexcept::mexcept(pmVar4,&local_23a0,INVALID_INSTR_OPCODE);
    local_23a2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd1:
    local_23ca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_23c8,"[-][mvm] invalid instruction opcode",&local_23c9);
    mexcept::mexcept(pmVar4,&local_23c8,INVALID_INSTR_OPCODE);
    local_23ca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd2:
    local_23f2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_23f0,"[-][mvm] invalid instruction opcode",&local_23f1);
    mexcept::mexcept(pmVar4,&local_23f0,INVALID_INSTR_OPCODE);
    local_23f2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd3:
    local_241a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2418,"[-][mvm] invalid instruction opcode",&local_2419);
    mexcept::mexcept(pmVar4,&local_2418,INVALID_INSTR_OPCODE);
    local_241a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd4:
    local_2442 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2440,"[-][mvm] invalid instruction opcode",&local_2441);
    mexcept::mexcept(pmVar4,&local_2440,INVALID_INSTR_OPCODE);
    local_2442 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd5:
    local_246a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2468,"[-][mvm] invalid instruction opcode",&local_2469);
    mexcept::mexcept(pmVar4,&local_2468,INVALID_INSTR_OPCODE);
    local_246a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd6:
    local_2492 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2490,"[-][mvm] invalid instruction opcode",&local_2491);
    mexcept::mexcept(pmVar4,&local_2490,INVALID_INSTR_OPCODE);
    local_2492 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd7:
    local_24ba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_24b8,"[-][mvm] invalid instruction opcode",&local_24b9);
    mexcept::mexcept(pmVar4,&local_24b8,INVALID_INSTR_OPCODE);
    local_24ba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd8:
    local_24e2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_24e0,"[-][mvm] invalid instruction opcode",&local_24e1);
    mexcept::mexcept(pmVar4,&local_24e0,INVALID_INSTR_OPCODE);
    local_24e2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd9:
    local_250a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2508,"[-][mvm] invalid instruction opcode",&local_2509);
    mexcept::mexcept(pmVar4,&local_2508,INVALID_INSTR_OPCODE);
    local_250a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xda:
    local_2532 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2530,"[-][mvm] invalid instruction opcode",&local_2531);
    mexcept::mexcept(pmVar4,&local_2530,INVALID_INSTR_OPCODE);
    local_2532 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdb:
    local_255a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2558,"[-][mvm] invalid instruction opcode",&local_2559);
    mexcept::mexcept(pmVar4,&local_2558,INVALID_INSTR_OPCODE);
    local_255a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdc:
    local_2582 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2580,"[-][mvm] invalid instruction opcode",&local_2581);
    mexcept::mexcept(pmVar4,&local_2580,INVALID_INSTR_OPCODE);
    local_2582 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdd:
    local_25aa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_25a8,"[-][mvm] invalid instruction opcode",&local_25a9);
    mexcept::mexcept(pmVar4,&local_25a8,INVALID_INSTR_OPCODE);
    local_25aa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xde:
    local_25d2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_25d0,"[-][mvm] invalid instruction opcode",&local_25d1);
    mexcept::mexcept(pmVar4,&local_25d0,INVALID_INSTR_OPCODE);
    local_25d2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdf:
    local_25fa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_25f8,"[-][mvm] invalid instruction opcode",&local_25f9);
    mexcept::mexcept(pmVar4,&local_25f8,INVALID_INSTR_OPCODE);
    local_25fa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe0:
    local_2622 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2620,"[-][mvm] invalid instruction opcode",&local_2621);
    mexcept::mexcept(pmVar4,&local_2620,INVALID_INSTR_OPCODE);
    local_2622 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe1:
    local_264a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2648,"[-][mvm] invalid instruction opcode",&local_2649);
    mexcept::mexcept(pmVar4,&local_2648,INVALID_INSTR_OPCODE);
    local_264a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe2:
    local_2672 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2670,"[-][mvm] invalid instruction opcode",&local_2671);
    mexcept::mexcept(pmVar4,&local_2670,INVALID_INSTR_OPCODE);
    local_2672 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe3:
    local_269a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2698,"[-][mvm] invalid instruction opcode",&local_2699);
    mexcept::mexcept(pmVar4,&local_2698,INVALID_INSTR_OPCODE);
    local_269a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe4:
    local_26c2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_26c0,"[-][mvm] invalid instruction opcode",&local_26c1);
    mexcept::mexcept(pmVar4,&local_26c0,INVALID_INSTR_OPCODE);
    local_26c2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe5:
    local_26ea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_26e8,"[-][mvm] invalid instruction opcode",&local_26e9);
    mexcept::mexcept(pmVar4,&local_26e8,INVALID_INSTR_OPCODE);
    local_26ea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe6:
    local_2712 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2710,"[-][mvm] invalid instruction opcode",&local_2711);
    mexcept::mexcept(pmVar4,&local_2710,INVALID_INSTR_OPCODE);
    local_2712 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe7:
    local_273a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2738,"[-][mvm] invalid instruction opcode",&local_2739);
    mexcept::mexcept(pmVar4,&local_2738,INVALID_INSTR_OPCODE);
    local_273a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe8:
    local_2762 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2760,"[-][mvm] invalid instruction opcode",&local_2761);
    mexcept::mexcept(pmVar4,&local_2760,INVALID_INSTR_OPCODE);
    local_2762 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe9:
    local_278a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2788,"[-][mvm] invalid instruction opcode",&local_2789);
    mexcept::mexcept(pmVar4,&local_2788,INVALID_INSTR_OPCODE);
    local_278a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xea:
    local_27b2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_27b0,"[-][mvm] invalid instruction opcode",&local_27b1);
    mexcept::mexcept(pmVar4,&local_27b0,INVALID_INSTR_OPCODE);
    local_27b2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xeb:
    local_27da = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_27d8,"[-][mvm] invalid instruction opcode",&local_27d9);
    mexcept::mexcept(pmVar4,&local_27d8,INVALID_INSTR_OPCODE);
    local_27da = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xec:
    local_2802 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2800,"[-][mvm] invalid instruction opcode",&local_2801);
    mexcept::mexcept(pmVar4,&local_2800,INVALID_INSTR_OPCODE);
    local_2802 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xed:
    local_282a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2828,"[-][mvm] invalid instruction opcode",&local_2829);
    mexcept::mexcept(pmVar4,&local_2828,INVALID_INSTR_OPCODE);
    local_282a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xee:
    local_2852 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2850,"[-][mvm] invalid instruction opcode",&local_2851);
    mexcept::mexcept(pmVar4,&local_2850,INVALID_INSTR_OPCODE);
    local_2852 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xef:
    local_287a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2878,"[-][mvm] invalid instruction opcode",&local_2879);
    mexcept::mexcept(pmVar4,&local_2878,INVALID_INSTR_OPCODE);
    local_287a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf0:
    local_28a2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28a0,"[-][mvm] invalid instruction opcode",&local_28a1);
    mexcept::mexcept(pmVar4,&local_28a0,INVALID_INSTR_OPCODE);
    local_28a2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf1:
    local_28ca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28c8,"[-][mvm] invalid instruction opcode",&local_28c9);
    mexcept::mexcept(pmVar4,&local_28c8,INVALID_INSTR_OPCODE);
    local_28ca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf2:
    local_28f2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28f0,"[-][mvm] invalid instruction opcode",&local_28f1);
    mexcept::mexcept(pmVar4,&local_28f0,INVALID_INSTR_OPCODE);
    local_28f2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf3:
    local_291a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2918,"[-][mvm] invalid instruction opcode",&local_2919);
    mexcept::mexcept(pmVar4,&local_2918,INVALID_INSTR_OPCODE);
    local_291a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf4:
    local_2942 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2940,"[-][mvm] invalid instruction opcode",&local_2941);
    mexcept::mexcept(pmVar4,&local_2940,INVALID_INSTR_OPCODE);
    local_2942 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf5:
    local_296a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2968,"[-][mvm] invalid instruction opcode",&local_2969);
    mexcept::mexcept(pmVar4,&local_2968,INVALID_INSTR_OPCODE);
    local_296a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf6:
    local_2992 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2990,"[-][mvm] invalid instruction opcode",&local_2991);
    mexcept::mexcept(pmVar4,&local_2990,INVALID_INSTR_OPCODE);
    local_2992 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf7:
    local_29ba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_29b8,"[-][mvm] invalid instruction opcode",&local_29b9);
    mexcept::mexcept(pmVar4,&local_29b8,INVALID_INSTR_OPCODE);
    local_29ba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf8:
    local_29e2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_29e0,"[-][mvm] invalid instruction opcode",&local_29e1);
    mexcept::mexcept(pmVar4,&local_29e0,INVALID_INSTR_OPCODE);
    local_29e2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf9:
    local_2a0a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a08,"[-][mvm] invalid instruction opcode",&local_2a09);
    mexcept::mexcept(pmVar4,&local_2a08,INVALID_INSTR_OPCODE);
    local_2a0a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfa:
    local_2a32 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a30,"[-][mvm] invalid instruction opcode",&local_2a31);
    mexcept::mexcept(pmVar4,&local_2a30,INVALID_INSTR_OPCODE);
    local_2a32 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfb:
    local_2a5a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a58,"[-][mvm] invalid instruction opcode",&local_2a59);
    mexcept::mexcept(pmVar4,&local_2a58,INVALID_INSTR_OPCODE);
    local_2a5a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfc:
    local_2a82 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a80,"[-][mvm] invalid instruction opcode",&local_2a81);
    mexcept::mexcept(pmVar4,&local_2a80,INVALID_INSTR_OPCODE);
    local_2a82 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfd:
    local_2aaa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2aa8,"[-][mvm] invalid instruction opcode",&local_2aa9);
    mexcept::mexcept(pmVar4,&local_2aa8,INVALID_INSTR_OPCODE);
    local_2aaa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfe:
    local_2ad2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2ad0,"[-][mvm] invalid instruction opcode",&local_2ad1);
    mexcept::mexcept(pmVar4,&local_2ad0,INVALID_INSTR_OPCODE);
    local_2ad2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xff:
    local_2afa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2af8,"[-][mvm] invalid instruction opcode",&local_2af9);
    mexcept::mexcept(pmVar4,&local_2af8,INVALID_INSTR_OPCODE);
    local_2afa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  default:
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b20,"[-][mvm] instruction opcode overflow",&local_2b21);
    mexcept::mexcept(pmVar4,&local_2b20,INSTR_OPCODE_OVERFLOW);
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  }
  instr_index._5_1_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b8);
  std::__cxx11::istringstream::~istringstream
            ((istringstream *)
             &tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t>
assembler<Set, MetaCodeImpl>::assemble(std::string const &line) const {
  std::istringstream iss(line);
  std::vector<std::string> tokens(std::istream_iterator<std::string>{iss},
                                  std::istream_iterator<std::string>());

  if (tokens.empty()) // need at leat an instruction name
  {
    throw mexcept("[-][mvm] no instruction token", status_type::NO_INSTR_NAME);
  }

  auto iname_it = std::find_if(
      std::cbegin(instr_set_traits_type::instr_names),
      std::cend(instr_set_traits_type::instr_names),
      [&](auto const &val) { return std::string(val) == tokens[0]; });

  if (iname_it == std::cend(instr_set_traits_type::instr_names)) {
    throw mexcept("[-][mvm] invalid instruction name",
                  status_type::BAD_INSTR_NAME);
  }

  LOG_INFO("assembler -> assemble instruction " << *iname_it);

  std::vector<uint8_t> bytecode;
  auto instr_index =
      std::distance(std::cbegin(instr_set_traits_type::instr_names), iname_it);

#ifdef FASTI
#define MVM_ASSEMBLE_I(n)                                                      \
  case n: {                                                                    \
    using instr_type = list::at_t<n, instr_set_desc_type>;                     \
    if constexpr (!std::is_same_v<instr_type, nonsuch>) {                      \
      bytecode = assemble_instr<instr_type>(                                   \
          static_cast<uint8_t>(n),                                             \
          (tokens.erase(std::begin(tokens)), tokens));                         \
    } else {                                                                   \
      throw mexcept("[-][mvm] invalid instruction opcode",                     \
                    status_type::INVALID_INSTR_OPCODE);                        \
    }                                                                          \
  } break;
  switch (instr_index) {
    MVM_UNROLL_256(MVM_ASSEMBLE_I)
  default:
    throw mexcept("[-][mvm] instruction opcode overflow",
                  status_type::INSTR_OPCODE_OVERFLOW);
  }
#else
  // visitor version suitable for small instruction sets
  instr_set_visitor<instr_set_desc_type>()(
      instr_index, [&tokens, &bytecode, instr_index, this](auto &&arg) {
        using instr_type = std::decay_t<decltype(arg)>;
        tokens.erase(std::begin(tokens));
        bytecode = this->assemble_instr<instr_type>(
            static_cast<uint8_t>(instr_index), tokens);
      });
#endif

  return bytecode;
}